

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sVertexArrayTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Stress::anon_unknown_1::SingleVertexArrayStrideTests::init
          (SingleVertexArrayStrideTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  Storage storage_;
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  int iVar1;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc;
  GLValue GVar2;
  GLValue GVar3;
  bool local_11d;
  int local_11c;
  undefined1 local_110 [8];
  string name;
  undefined1 local_e0 [8];
  Spec spec;
  undefined4 uStack_a4;
  undefined1 local_98 [8];
  ArraySpec arraySpec;
  int iStack_4c;
  bool bufferUnaligned;
  int stride;
  int strideNdx;
  int countNdx;
  int componentCount;
  int storageNdx;
  int inputTypeNdx;
  int strides [1];
  int counts [2];
  Storage storages [1];
  InputType inputTypes [4];
  SingleVertexArrayStrideTests *this_local;
  
  stack0xffffffffffffffd8 = 0x400000000;
  counts[0] = 1;
  _inputTypeNdx = 0x10000000001;
  iVar1 = 0x11;
  storageNdx = 0x11;
  componentCount = 0;
  while (componentCount < 4) {
    for (countNdx = 0; countNdx < 1; countNdx = countNdx + 1) {
      for (strideNdx = 2; strideNdx < 5; strideNdx = strideNdx + 1) {
        for (stride = 0; stride < 2; stride = stride + 1) {
          for (iStack_4c = 0; iStack_4c < 1; iStack_4c = iStack_4c + 1) {
            if ((&storageNdx)[iStack_4c] < 0) {
              local_11c = deqp::gls::Array::inputTypeSize(counts[(long)componentCount + 1]);
              local_11c = local_11c * strideNdx;
            }
            else {
              local_11c = (&storageNdx)[iStack_4c];
            }
            local_11d = false;
            if (counts[countNdx] == 1) {
              iVar1 = deqp::gls::Array::inputTypeSize(counts[(long)componentCount + 1]);
              local_11d = local_11c % iVar1 != 0;
            }
            arraySpec.max.field_1._7_1_ = local_11d;
            type = counts[(long)componentCount + 1];
            storage_ = counts[countNdx];
            GVar2 = deqp::gls::GLValue::getMinValue(type);
            GVar3 = deqp::gls::GLValue::getMaxValue(counts[(long)componentCount + 1]);
            spec.arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = GVar3.type;
            max_._4_4_ = spec.arrays.
                         super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            max_.type = (InputType)
                        spec.arrays.
                        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            min_._4_4_ = uStack_a4;
            min_.type = GVar2.type;
            min_.field_1 = GVar2.field_1;
            max_.field_1 = GVar3.field_1;
            deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                      ((ArraySpec *)local_98,type,OUTPUTTYPE_VEC4,storage_,USAGE_DYNAMIC_DRAW,
                       strideNdx,0,local_11c,false,min_,max_);
            deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_e0);
            local_e0._0_4_ = PRIMITIVE_TRIANGLES;
            local_e0._4_4_ = strides[(long)stride + -1];
            spec.primitive = PRIMITIVE_POINTS;
            std::
            vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                         *)&spec.first,(ArraySpec *)local_98);
            deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_
                      ((string *)local_110,(Spec *)local_e0);
            if ((arraySpec.max.field_1._7_1_ & 1) != 0) {
              this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
              testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
              renderCtx = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
              name_00 = (char *)std::__cxx11::string::c_str();
              desc = (char *)std::__cxx11::string::c_str();
              deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                        (this_00,testCtx,renderCtx,(Spec *)local_e0,name_00,desc);
              tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
            }
            std::__cxx11::string::~string((string *)local_110);
            deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_e0);
          }
        }
      }
    }
    iVar1 = componentCount + 1;
    componentCount = iVar1;
  }
  return iVar1;
}

Assistant:

void SingleVertexArrayStrideTests::init (void)
{
	// Test strides with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE, /*Array::INPUTTYPE_UNSIGNED_SHORT, Array::INPUTTYPE_UNSIGNED_BYTE,*/ Array::INPUTTYPE_FIXED};
	Array::Storage		storages[]		= {Array::STORAGE_BUFFER};
	int					counts[]		= {1, 256};
	int					strides[]		= {17};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
		{
			for (int componentCount = 2; componentCount < 5; componentCount++)
			{
				for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
				{
					for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
					{
						const int	stride			= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * componentCount : strides[strideNdx]);
						const bool	bufferUnaligned	= (storages[storageNdx] == Array::STORAGE_BUFFER) && (stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) != 0;

						MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																		Array::OUTPUTTYPE_VEC4,
																		storages[storageNdx],
																		Array::USAGE_DYNAMIC_DRAW,
																		componentCount,
																		0,
																		stride,
																		false,
																		GLValue::getMinValue(inputTypes[inputTypeNdx]),
																		GLValue::getMaxValue(inputTypes[inputTypeNdx]));

						MultiVertexArrayTest::Spec spec;
						spec.primitive	= Array::PRIMITIVE_TRIANGLES;
						spec.drawCount	= counts[countNdx];
						spec.first		= 0;
						spec.arrays.push_back(arraySpec);

						std::string name = spec.getName();
						if (bufferUnaligned)
							addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
					}
				}
			}
		}
	}
}